

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O2

string * __thiscall
antlr::CommonToken::toString_abi_cxx11_(string *__return_storage_ptr__,CommonToken *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->super_Token)._vptr_Token[4])(&local_38);
  std::operator+(&bStack_118,"[\"",&local_38);
  std::operator+(&local_f8,&bStack_118,"\",<");
  iVar1 = (*(this->super_Token)._vptr_Token[6])(this);
  antlr::operator+(&local_d8,&local_f8,iVar1);
  std::operator+(&local_b8,&local_d8,">,line=");
  iVar1 = (*(this->super_Token)._vptr_Token[3])(this);
  antlr::operator+(&local_98,&local_b8,iVar1);
  std::operator+(&local_78,&local_98,",column=");
  iVar1 = (*(this->super_Token)._vptr_Token[2])(this);
  antlr::operator+(&local_58,&local_78,iVar1);
  std::operator+(__return_storage_ptr__,&local_58,"]");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&bStack_118);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CommonToken::toString() const
{
	return "[\""+getText()+"\",<"+getType()+">,line="+getLine()+",column="+getColumn()+"]";
}